

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

void Mf_ObjMergeOrder(Mf_Man_t *p,int iObj)

{
  int *pVars;
  uint *puVar1;
  float fVar2;
  ushort uVar3;
  uint nCutNum;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  Mf_Obj_t *pMVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  Jf_Par_t *pJVar9;
  Gia_Obj_t *pGVar10;
  ulong *puVar11;
  ulong *puVar12;
  Vec_Mem_t *pVVar13;
  word **ppwVar14;
  word *pwVar15;
  word *pwVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  uint uVar24;
  ulong uVar25;
  Mf_Obj_t *pMVar26;
  int *piVar27;
  ulong uVar28;
  void *pvVar29;
  void **ppvVar30;
  int nSizeB;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  byte bVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  int iVar41;
  ulong uVar42;
  ulong uVar43;
  int iVar44;
  ulong *puVar45;
  ulong uVar46;
  long lVar47;
  uint uVar48;
  uint *puVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  long lVar53;
  undefined1 *puVar54;
  uint uVar55;
  uint uVar56;
  int iVar57;
  int iVar58;
  word *pwVar59;
  uint uVar60;
  uint *puVar61;
  undefined8 *puVar62;
  int *piVar63;
  ulong *puVar64;
  int iVar65;
  int iVar66;
  undefined8 *puVar67;
  Gia_Man_t *pGVar68;
  bool bVar69;
  bool bVar70;
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  word uTruth [16];
  word uTruth0 [16];
  Mf_Cut_t *pCutsR [16];
  word uTruth1 [16];
  Mf_Cut_t pCuts2 [16];
  word uRes [4];
  Mf_Cut_t pCuts1 [16];
  Mf_Cut_t pCuts0 [16];
  Mf_Cut_t pCuts [16];
  ulong *local_1388;
  ulong *local_1378;
  uint local_1344;
  uint local_1334;
  undefined8 local_12f8;
  uint uStack_12f0;
  uint uStack_12ec;
  uint local_12e8;
  uint uStack_12e4;
  uint uStack_12e0;
  uint uStack_12dc;
  word local_1278 [16];
  Mf_Cut_t *local_11f8;
  long local_11f0 [15];
  uint local_1178;
  uint uStack_1174;
  uint uStack_1170;
  uint uStack_116c;
  uint local_1168;
  uint uStack_1164;
  uint uStack_1160;
  uint uStack_115c;
  undefined8 local_1158;
  uint uStack_1150;
  uint uStack_114c;
  uint local_1148;
  uint uStack_1144;
  uint uStack_1140;
  uint uStack_113c;
  word local_10d8 [16];
  undefined8 local_1058;
  undefined8 uStack_1050;
  uint local_1048;
  uint uStack_1044;
  uint uStack_1040;
  uint uStack_103c;
  undefined8 local_1018 [120];
  word local_c58 [4];
  ulong local_c38 [2];
  uint local_c28;
  int local_c24 [251];
  ulong local_838 [2];
  uint local_828;
  int local_824 [251];
  undefined1 local_438 [1032];
  
  if ((iObj < 0) || (p->pGia->nObjs <= iObj)) {
LAB_006e6ff2:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar5 = p->pGia->pObjs;
  pMVar6 = p->pLfObjs;
  uVar48 = p->pPars->nLutSize;
  uVar28 = (ulong)uVar48;
  nCutNum = p->pPars->nCutNum;
  iVar44 = iObj - (*(uint *)(pGVar5 + (uint)iObj) & 0x1fffffff);
  iVar65 = pMVar6[iVar44].iCutSet;
  pMVar26 = pMVar6;
  if (iVar65 == 0) {
    local_838[1] = 0;
    local_828 = 0x8000002;
    local_824[0] = iVar44;
    local_838[0] = 1L << ((byte)iVar44 & 0x3f);
    iVar36 = 1;
  }
  else {
    uVar31 = iVar65 >> 0x10;
    if (((int)uVar31 < 0) || ((p->vPages).nSize <= (int)uVar31)) goto LAB_006e6fd3;
    pvVar29 = (p->vPages).pArray[uVar31];
    iVar36 = *(int *)((long)pvVar29 + (ulong)(ushort)iVar65 * 4);
    if (0 < iVar36) {
      piVar27 = (int *)((long)pvVar29 + (ulong)(ushort)iVar65 * 4);
      puVar49 = (uint *)(piVar27 + 1);
      iVar65 = 0;
      puVar45 = local_838;
      do {
        puVar64 = puVar45;
        puVar64[1] = 0;
        uVar31 = *puVar49;
        *(uint *)(puVar64 + 2) = (uint)puVar64[2] & 0xf8000000 | uVar31 >> 5;
        *(uint *)(puVar64 + 2) = *puVar49 << 0x1b | uVar31 >> 5;
        uVar31 = *puVar49 & 0x1f;
        if (uVar31 == 0) {
          uVar25 = 0;
        }
        else {
          uVar32 = 0;
          uVar25 = 0;
          do {
            uVar25 = uVar25 | 1L << ((ulong)(byte)(puVar49 + 1)[uVar32] & 0x3f);
            uVar32 = uVar32 + 1;
          } while (uVar31 != uVar32);
        }
        *puVar64 = uVar25;
        memcpy((void *)((long)puVar64 + 0x14),puVar49 + 1,(ulong)(uVar31 << 2));
        iVar65 = iVar65 + 1;
        puVar49 = puVar49 + (ulong)(*puVar49 & 0x1f) + 1;
        iVar36 = *piVar27;
        puVar45 = puVar64 + 8;
      } while (iVar65 < iVar36);
      if (0xfffffff < local_828) {
        puVar64[9] = 0;
        *(undefined4 *)(puVar64 + 10) = 0x8000002;
        *(int *)((long)puVar64 + 0x54) = iVar44;
        puVar64[8] = 1L << ((byte)iVar44 & 0x3f);
        iVar36 = iVar36 + 1;
        pMVar26 = p->pLfObjs;
      }
    }
  }
  pGVar5 = pGVar5 + (uint)iObj;
  iVar44 = iObj - (*(uint *)&pGVar5->field_0x4 & 0x1fffffff);
  iVar65 = pMVar26[iVar44].iCutSet;
  if (iVar65 == 0) {
    local_c38[1] = 0;
    local_c28 = 0x8000002;
    local_c24[0] = iVar44;
    local_c38[0] = 1L << ((byte)iVar44 & 0x3f);
    iVar37 = 1;
  }
  else {
    uVar31 = iVar65 >> 0x10;
    if (((int)uVar31 < 0) || ((p->vPages).nSize <= (int)uVar31)) goto LAB_006e6fd3;
    pvVar29 = (p->vPages).pArray[uVar31];
    iVar37 = *(int *)((long)pvVar29 + (ulong)(ushort)iVar65 * 4);
    if (iVar37 < 1) {
      puVar45 = local_c38;
    }
    else {
      piVar27 = (int *)((long)pvVar29 + (ulong)(ushort)iVar65 * 4);
      puVar49 = (uint *)(piVar27 + 1);
      puVar45 = local_c38;
      iVar65 = 0;
      do {
        puVar45[1] = 0;
        uVar31 = *puVar49;
        *(uint *)(puVar45 + 2) = (uint)puVar45[2] & 0xf8000000 | uVar31 >> 5;
        *(uint *)(puVar45 + 2) = *puVar49 << 0x1b | uVar31 >> 5;
        uVar31 = *puVar49 & 0x1f;
        if (uVar31 == 0) {
          uVar25 = 0;
        }
        else {
          uVar32 = 0;
          uVar25 = 0;
          do {
            uVar25 = uVar25 | 1L << ((ulong)(byte)(puVar49 + 1)[uVar32] & 0x3f);
            uVar32 = uVar32 + 1;
          } while (uVar31 != uVar32);
        }
        *puVar45 = uVar25;
        memcpy((void *)((long)puVar45 + 0x14),puVar49 + 1,(ulong)(uVar31 << 2));
        puVar45 = puVar45 + 8;
        iVar65 = iVar65 + 1;
        puVar49 = puVar49 + (ulong)(*puVar49 & 0x1f) + 1;
        iVar37 = *piVar27;
      } while (iVar65 < iVar37);
    }
    if (0xfffffff < local_c28) {
      puVar45[1] = 0;
      *(undefined4 *)(puVar45 + 2) = 0x8000002;
      *(int *)((long)puVar45 + 0x14) = iVar44;
      *puVar45 = 1L << ((byte)iVar44 & 0x3f);
      iVar37 = iVar37 + 1;
    }
  }
  pGVar68 = p->pGia;
  piVar27 = pGVar68->pSibls;
  if (piVar27 == (int *)0x0) {
    uVar31 = 0;
  }
  else {
    uVar31 = piVar27[(uint)iObj];
  }
  uVar25 = *(ulong *)pGVar5;
  if (0 < (int)nCutNum) {
    lVar53 = (ulong)nCutNum - 1;
    auVar71._8_4_ = (int)lVar53;
    auVar71._0_8_ = lVar53;
    auVar71._12_4_ = (int)((ulong)lVar53 >> 0x20);
    puVar54 = local_438;
    lVar53 = 0;
    auVar71 = auVar71 ^ _DAT_007ee2e0;
    auVar73 = _DAT_007ee2d0;
    do {
      auVar74 = auVar73 ^ _DAT_007ee2e0;
      if ((bool)(~(auVar74._4_4_ == auVar71._4_4_ && auVar71._0_4_ < auVar74._0_4_ ||
                  auVar71._4_4_ < auVar74._4_4_) & 1)) {
        *(undefined1 **)((long)local_11f0 + lVar53 + -8) = puVar54;
      }
      if ((auVar74._12_4_ != auVar71._12_4_ || auVar74._8_4_ <= auVar71._8_4_) &&
          auVar74._12_4_ <= auVar71._12_4_) {
        *(undefined1 **)((long)local_11f0 + lVar53) = puVar54 + 0x40;
      }
      lVar47 = auVar73._8_8_;
      auVar73._0_8_ = auVar73._0_8_ + 2;
      auVar73._8_8_ = lVar47 + 2;
      lVar53 = lVar53 + 0x10;
      puVar54 = puVar54 + 0x80;
    } while ((ulong)(nCutNum + 1 >> 1) << 4 != lVar53);
  }
  pMVar6 = pMVar6 + (uint)iObj;
  uVar50 = (uint)(uVar25 >> 0x20);
  if (uVar31 == 0) {
LAB_006e49fd:
    uVar31 = 0;
  }
  else {
    iVar65 = piVar27[(uint)iObj];
    if (((long)iVar65 < 0) || (pGVar68->nObjs <= iVar65)) goto LAB_006e6ff2;
    uVar7 = *(undefined8 *)(pGVar68->pObjs + iVar65);
    iVar65 = p->pLfObjs[(int)uVar31].iCutSet;
    if (iVar65 == 0) {
      puVar67 = local_1018;
      uStack_1050 = 0;
      local_1048 = 0x8000002;
      uStack_1044 = uVar31;
      local_1058 = 1L << ((byte)uVar31 & 0x3f);
    }
    else {
      uVar31 = iVar65 >> 0x10;
      if (((int)uVar31 < 0) || ((p->vPages).nSize <= (int)uVar31)) goto LAB_006e6fd3;
      pvVar29 = (p->vPages).pArray[uVar31];
      if (*(int *)((long)pvVar29 + (ulong)(ushort)iVar65 * 4) < 1) goto LAB_006e49fd;
      puVar49 = (uint *)((long)pvVar29 + (ulong)(ushort)iVar65 * 4);
      puVar45 = &local_1058;
      iVar65 = 0;
      puVar1 = puVar49;
      do {
        puVar61 = puVar1 + 1;
        puVar45[1] = 0;
        uVar31 = *puVar61;
        *(uint *)(puVar45 + 2) = (uint)puVar45[2] & 0xf8000000 | uVar31 >> 5;
        *(uint *)(puVar45 + 2) = *puVar61 << 0x1b | uVar31 >> 5;
        uVar31 = *puVar61 & 0x1f;
        if (uVar31 == 0) {
          uVar32 = 0;
        }
        else {
          uVar33 = 0;
          uVar32 = 0;
          do {
            uVar32 = uVar32 | 1L << ((ulong)(byte)(puVar1 + 2)[uVar33] & 0x3f);
            uVar33 = uVar33 + 1;
          } while (uVar31 != uVar33);
        }
        *puVar45 = uVar32;
        memcpy((void *)((long)puVar45 + 0x14),puVar1 + 2,(ulong)(uVar31 << 2));
        puVar45 = puVar45 + 8;
        iVar65 = iVar65 + 1;
        puVar1 = puVar61 + (*puVar61 & 0x1f);
        uVar31 = *puVar49;
      } while (iVar65 < (int)uVar31);
      if ((int)uVar31 < 1) {
        uVar31 = 0;
        goto LAB_006e4bb8;
      }
      puVar67 = &local_1058 + (ulong)uVar31 * 8;
    }
    puVar62 = &local_1058;
    uVar31 = 0;
    do {
      puVar8 = (undefined8 *)local_11f0[(long)(int)uVar31 + -1];
      uVar17 = *puVar62;
      uVar18 = puVar62[1];
      uVar19 = puVar62[3];
      uVar20 = puVar62[4];
      uVar21 = puVar62[5];
      uVar22 = puVar62[6];
      uVar23 = puVar62[7];
      puVar8[2] = puVar62[2];
      puVar8[3] = uVar19;
      puVar8[6] = uVar22;
      puVar8[7] = uVar23;
      puVar8[4] = uVar20;
      puVar8[5] = uVar21;
      *puVar8 = uVar17;
      puVar8[1] = uVar18;
      uVar39 = *(uint *)(puVar8 + 2);
      *(uint *)(puVar8 + 2) =
           uVar39 & 0xf8000000 |
           uVar39 & 0x7ffffff ^ ((uint)((ulong)uVar7 >> 0x20) ^ uVar50) >> 0x1f;
      uVar38 = uVar39 >> 0x1b;
      pJVar9 = p->pPars;
      if (pJVar9->nLutSize < (int)uVar38) {
LAB_006e6de3:
        __assert_fail("nLeaves <= p->pPars->nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                      ,0x3ba,"void Mf_CutParams(Mf_Man_t *, Mf_Cut_t *, float)");
      }
      fVar2 = pMVar6->nFlowRefs;
      puVar8[1] = 0;
      if (uVar39 < 0x8000000) {
        iVar65 = 0;
        auVar74 = ZEXT816(0);
      }
      else {
        pMVar26 = p->pLfObjs;
        uVar32 = 0;
        auVar74 = ZEXT816(0);
        uVar51 = 0;
        do {
          iVar65 = *(int *)((long)puVar8 + uVar32 * 4 + 0x14);
          uVar3 = *(ushort *)&pMVar26[iVar65].field_0xc;
          uVar52 = (uint)uVar3;
          if (uVar3 < uVar51) {
            uVar52 = uVar51;
          }
          uVar51 = uVar52;
          *(uint *)(puVar8 + 1) = uVar51;
          auVar74._0_4_ = auVar74._0_4_ + pMVar26[iVar65].Flow;
          *(float *)((long)puVar8 + 0xc) = auVar74._0_4_;
          uVar32 = uVar32 + 1;
        } while (uVar38 != uVar32);
        iVar65 = 0;
        *(uint *)(puVar8 + 1) = (uVar51 + 1) - (uint)(uVar39 < 0x10000000);
        if (0xfffffff < uVar39) {
          if (pJVar9->fGenCnf == 0) {
            if (pJVar9->fOptEdge == 0) {
              iVar65 = 1;
            }
            else {
              iVar65 = uVar38 + pJVar9->nAreaTuner;
            }
          }
          else {
            uVar39 = uVar39 >> 1 & 0x3ffffff;
            if ((p->vCnfSizes).nSize <= (int)uVar39) {
LAB_006e6edb:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar65 = (p->vCnfSizes).pArray[uVar39];
          }
        }
      }
      *(float *)((long)puVar8 + 0xc) = ((float)iVar65 + auVar74._0_4_) / fVar2;
      uVar31 = Mf_SetAddCut(&local_11f8,uVar31,nCutNum);
      puVar62 = puVar62 + 8;
    } while (puVar62 < puVar67);
    pGVar68 = p->pGia;
  }
LAB_006e4bb8:
  uVar39 = (uint)(uVar25 >> 0x1d) & 1;
  uVar50 = uVar50 >> 0x1d & 1;
  if ((pGVar68->pMuxes == (uint *)0x0) || (uVar38 = pGVar68->pMuxes[(uint)iObj], uVar38 == 0)) {
    uVar38 = (uint)*(ulong *)pGVar5;
    bVar70 = (~uVar38 & 0x1fffffff) != 0;
    bVar69 = (uVar38 & 0x1fffffff) < ((uint)(*(ulong *)pGVar5 >> 0x20) & 0x1fffffff);
    p->CutCount[0] = (double)(iVar37 * iVar36) + p->CutCount[0];
    if (0 < iVar36) {
      piVar27 = local_824;
      local_1378 = local_838;
      do {
        if (0 < iVar37) {
          piVar63 = local_c24;
          puVar45 = local_c38;
LAB_006e4dca:
          uVar51 = (uint)local_1378[2];
          uVar52 = uVar51 >> 0x1b;
          uVar25 = puVar45[2];
          uVar40 = (uint)uVar25 >> 0x1b;
          if (((int)uVar48 < (int)(uVar40 + uVar52)) &&
             (uVar32 = (*puVar45 | *local_1378) -
                       ((*puVar45 | *local_1378) >> 1 & 0x5555555555555555),
             uVar32 = (uVar32 >> 2 & 0x3333333333333333) + (uVar32 & 0x3333333333333333),
             (int)uVar48 <
             (int)(uint)(byte)(((uVar32 >> 4) + uVar32 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                              0x38))) goto LAB_006e5ae2;
          p->CutCount[1] = p->CutCount[1] + 1.0;
          puVar64 = (ulong *)local_11f0[(long)(int)uVar31 + -1];
          pVars = (int *)((long)puVar64 + 0x14);
          if ((uVar52 != uVar48) || (uVar40 != uVar48)) {
            iVar65 = 0;
            uVar55 = 0;
            if (uVar51 < 0x8000000) {
LAB_006e4ec9:
              if ((int)(uVar55 + uVar40) <= (int)(iVar65 + uVar48)) {
                if (iVar65 < (int)uVar40) {
                  lVar53 = 0;
                  do {
                    *(int *)((long)puVar64 + lVar53 * 4 + (long)(int)uVar55 * 4 + 0x14) =
                         piVar63[iVar65 + lVar53];
                    lVar53 = lVar53 + 1;
                  } while ((ulong)uVar40 - (long)iVar65 != lVar53);
LAB_006e4f58:
                  uVar55 = uVar55 + (int)lVar53;
                }
                goto LAB_006e4f5a;
              }
            }
            else {
              iVar44 = 0;
              uVar55 = 0;
              if ((uint)uVar25 < 0x8000000) {
LAB_006e4f19:
                if ((int)(uVar55 + uVar52) <= (int)(iVar44 + uVar48)) {
                  if (iVar44 < (int)uVar52) {
                    lVar53 = 0;
                    do {
                      *(int *)((long)puVar64 + lVar53 * 4 + (long)(int)uVar55 * 4 + 0x14) =
                           piVar27[iVar44 + lVar53];
                      lVar53 = lVar53 + 1;
                    } while ((ulong)uVar52 - (long)iVar44 != lVar53);
                    goto LAB_006e4f58;
                  }
                  goto LAB_006e4f5a;
                }
              }
              else if (uVar48 != 0) {
                uVar25 = 0;
                iVar44 = 0;
                iVar57 = 0;
                do {
                  iVar65 = *(int *)((long)local_1378 + (long)iVar44 * 4 + 0x14);
                  iVar41 = *(int *)((long)puVar45 + (long)iVar57 * 4 + 0x14);
                  if (iVar65 < iVar41) {
                    iVar44 = iVar44 + 1;
                    pVars[uVar25] = iVar65;
                    iVar65 = iVar57;
                    if ((int)uVar52 <= iVar44) {
LAB_006e57d5:
                      uVar55 = (int)uVar25 + 1;
                      goto LAB_006e4ec9;
                    }
                  }
                  else {
                    if (iVar41 < iVar65) {
                      pVars[uVar25] = iVar41;
                    }
                    else {
                      iVar44 = iVar44 + 1;
                      pVars[uVar25] = iVar65;
                      iVar65 = iVar57 + 1;
                      if ((int)uVar52 <= iVar44) goto LAB_006e57d5;
                    }
                    iVar57 = iVar57 + 1;
                    if ((int)uVar40 <= iVar57) {
                      uVar55 = (int)uVar25 + 1;
                      goto LAB_006e4f19;
                    }
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar28 != uVar25);
              }
            }
            goto LAB_006e5ae2;
          }
          uVar55 = uVar48;
          if (0x7ffffff < uVar51) {
            uVar25 = 0;
            do {
              if (piVar27[uVar25] != piVar63[uVar25]) goto LAB_006e5ae2;
              pVars[uVar25] = piVar27[uVar25];
              uVar25 = uVar25 + 1;
            } while (uVar28 != uVar25);
          }
LAB_006e4f5a:
          *(uint *)(puVar64 + 2) = uVar55 * 0x8000000 + 0x7ffffff;
          uVar25 = *puVar45;
          uVar32 = *local_1378;
          *puVar64 = uVar25 | uVar32;
          if (0 < (int)uVar31) {
            uVar51 = uVar55 & 0x1f;
            uVar33 = 0;
            do {
              puVar11 = (ulong *)local_11f0[uVar33 - 1];
              uVar52 = (uint)puVar11[2] >> 0x1b;
              if ((uVar52 <= uVar51) && ((*puVar11 & ~(uVar25 | uVar32)) == 0)) {
                if (uVar51 == uVar52) {
                  if (uVar55 * 0x8000000 == 0) goto LAB_006e5ae2;
                  uVar34 = 0;
                  while (pVars[uVar34] == *(int *)((long)puVar11 + uVar34 * 4 + 0x14)) {
                    uVar34 = uVar34 + 1;
                    if (uVar51 == uVar34) goto LAB_006e5ae2;
                  }
                }
                else {
                  if (uVar51 <= uVar52) {
LAB_006e6dc4:
                    __assert_fail("nSizeB > nSizeC",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                                  ,0x367,"int Mf_SetCutIsContainedOrder(Mf_Cut_t *, Mf_Cut_t *)");
                  }
                  if ((uint)puVar11[2] < 0x8000000) goto LAB_006e5ae2;
                  uVar34 = 0;
                  uVar40 = 0;
                  do {
                    iVar65 = *(int *)((long)puVar11 + (long)(int)uVar40 * 4 + 0x14);
                    if (iVar65 < pVars[uVar34]) break;
                    if ((pVars[uVar34] == iVar65) && (uVar40 = uVar40 + 1, uVar40 == uVar52))
                    goto LAB_006e5ae2;
                    uVar34 = uVar34 + 1;
                  } while (uVar51 != uVar34);
                }
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 != uVar31);
          }
          p->CutCount[2] = p->CutCount[2] + 1.0;
          if (p->pPars->fCutMin == 0) {
            uVar51 = (uint)puVar64[2];
            goto LAB_006e59c9;
          }
          iVar65 = p->pPars->nLutSize;
          if (iVar65 < 7) {
            pVVar13 = p->vTtMem;
            uVar51 = (uint)local_1378[2];
            uVar52 = uVar51 >> 1 & 0x3ffffff;
            if (pVVar13->nEntries <= (int)uVar52) goto LAB_006e6da5;
            uVar40 = (uint)puVar45[2];
            uVar55 = uVar40 >> 1 & 0x3ffffff;
            if ((uint)pVVar13->nEntries <= uVar55) goto LAB_006e6da5;
            uVar56 = (uint)puVar64[2];
            bVar35 = (byte)pVVar13->LogPageSze;
            uVar24 = uVar56 >> 0x1b;
            uVar25 = (ulong)uVar24;
            uVar32 = -(ulong)((uVar51 & 1) != uVar39) ^
                     pVVar13->ppPages[uVar52 >> (bVar35 & 0x1f)]
                     [(int)((uVar52 & pVVar13->PageMask) * pVVar13->nEntrySize)];
            uVar33 = -(ulong)((uVar40 & 1) != uVar50) ^
                     pVVar13->ppPages[uVar55 >> (bVar35 & 0x1f)]
                     [(int)((pVVar13->PageMask & uVar55) * pVVar13->nEntrySize)];
            uVar52 = (uVar51 >> 0x1b) - 1;
            if (0x7ffffff < uVar51 && 0x7ffffff < uVar56) {
              lVar53 = uVar25 * 0x18 + 0x934298;
              uVar34 = uVar25;
              do {
                uVar42 = uVar34 - 1;
                uVar43 = (ulong)uVar52;
                iVar65 = *(int *)((long)local_1378 + uVar43 * 4 + 0x14);
                iVar44 = *(int *)((long)puVar64 + uVar42 * 4 + 0x14);
                if (iVar44 <= iVar65) {
                  if (iVar44 != iVar65) goto LAB_006e6d67;
                  if (uVar43 < uVar42) {
                    bVar35 = (char)(-1 << ((byte)uVar52 & 0x1f)) +
                             (char)(1 << ((byte)uVar42 & 0x1f));
                    lVar47 = uVar43 * 0x90;
                    uVar32 = (uVar32 & *(ulong *)(lVar53 + lVar47)) >> (bVar35 & 0x3f) |
                             (*(ulong *)(lVar53 + -8 + lVar47) & uVar32) << (bVar35 & 0x3f) |
                             *(ulong *)(lVar53 + -0x10 + lVar47) & uVar32;
                  }
                  uVar52 = uVar52 - 1;
                }
              } while ((1 < uVar34) && (lVar53 = lVar53 + -0x18, uVar34 = uVar42, -1 < (int)uVar52))
              ;
            }
            if (uVar52 != 0xffffffff) {
LAB_006e6e02:
              __assert_fail("k == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                            ,0x594,"word Abc_Tt6Expand(word, int *, int, int *, int)");
            }
            uVar51 = (uVar40 >> 0x1b) - 1;
            if (0x7ffffff < uVar40 && 0x7ffffff < uVar56) {
              lVar53 = uVar25 * 0x18 + 0x934298;
              uVar34 = uVar25;
              do {
                uVar42 = uVar34 - 1;
                uVar43 = (ulong)uVar51;
                iVar65 = *(int *)((long)puVar45 + uVar43 * 4 + 0x14);
                iVar44 = *(int *)((long)puVar64 + uVar42 * 4 + 0x14);
                if (iVar44 <= iVar65) {
                  if (iVar44 != iVar65) {
LAB_006e6d67:
                    __assert_fail("pCut[i] == pCut0[k]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                  ,0x58f,"word Abc_Tt6Expand(word, int *, int, int *, int)");
                  }
                  if (uVar43 < uVar42) {
                    bVar35 = (char)(-1 << ((byte)uVar51 & 0x1f)) +
                             (char)(1 << ((byte)uVar42 & 0x1f));
                    lVar47 = uVar43 * 0x90;
                    uVar33 = (uVar33 & *(ulong *)(lVar53 + lVar47)) >> (bVar35 & 0x3f) |
                             (*(ulong *)(lVar53 + -8 + lVar47) & uVar33) << (bVar35 & 0x3f) |
                             *(ulong *)(lVar53 + -0x10 + lVar47) & uVar33;
                  }
                  uVar51 = uVar51 - 1;
                }
              } while ((1 < uVar34) && (lVar53 = lVar53 + -0x18, uVar34 = uVar42, -1 < (int)uVar51))
              ;
            }
            if (uVar51 != 0xffffffff) goto LAB_006e6e02;
            uVar34 = uVar33 & uVar32;
            if ((bVar70 && -1 < (int)uVar38) && bVar69) {
              uVar34 = uVar33 ^ uVar32;
            }
            uVar51 = (uint)uVar34 & 1;
            uVar34 = -(ulong)uVar51 ^ uVar34;
            uVar52 = 0;
            uVar32 = uVar34;
            if (0x7ffffff < uVar56) {
              uVar33 = 0;
              lVar53 = 0x9342a8;
              pwVar59 = s_Truths6Neg;
              uVar52 = 0;
              do {
                bVar35 = (byte)(1 << ((byte)uVar33 & 0x1f));
                if ((*pwVar59 & (uVar32 >> (bVar35 & 0x3f) ^ uVar32)) != 0) {
                  lVar47 = (long)(int)uVar52;
                  if (lVar47 < (long)uVar33) {
                    pVars[lVar47] = pVars[uVar33];
                    bVar35 = (char)(-1 << ((byte)uVar52 & 0x1f)) + bVar35;
                    lVar47 = lVar47 * 0x90;
                    uVar32 = (uVar32 & *(ulong *)(lVar53 + 8 + lVar47)) >> (bVar35 & 0x3f) |
                             (*(ulong *)(lVar53 + lVar47) & uVar32) << (bVar35 & 0x3f) |
                             *(ulong *)(lVar53 + -8 + lVar47) & uVar32;
                  }
                  uVar52 = uVar52 + 1;
                }
                uVar33 = uVar33 + 1;
                pwVar59 = pwVar59 + 1;
                lVar53 = lVar53 + 0x18;
              } while (uVar25 != uVar33);
            }
            local_1058 = uVar34;
            if ((uVar52 != uVar24) && (local_1058 = uVar32, (int)uVar24 <= (int)uVar52)) {
LAB_006e6efa:
              local_1058 = uVar34;
              __assert_fail("k < nVars",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                            ,0x5b6,"int Abc_Tt6MinBase(word *, int *, int)");
            }
            uVar25 = local_1058;
            *(uint *)(puVar64 + 2) = (uint)puVar64[2] & 0x7ffffff | uVar52 << 0x1b;
            if ((local_1058 & 1) != 0) {
              __assert_fail("(int)(t & 1) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                            ,500,
                            "int Mf_CutComputeTruth6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                           );
            }
            uVar52 = Vec_MemHashInsert(p->vTtMem,&local_1058);
            if ((int)uVar52 < 0) {
LAB_006e6e40:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10b,"int Abc_Var2Lit(int, int)");
            }
            uVar32 = puVar64[2];
            uVar51 = (uint)uVar32 & 0xf8000000 | uVar51 + (uVar52 & 0x3ffffff) * 2;
            *(uint *)(puVar64 + 2) = uVar51;
            if ((p->pPars->fGenCnf != 0) && (uVar52 == (p->vCnfSizes).nSize)) {
              uVar51 = (uint)uVar32 >> 0x1b;
              local_12f8 = local_12f8 & 0xffffffff00000000;
              Abc_Tt6Isop(uVar25,uVar25,uVar51,(int *)&local_12f8);
              Abc_Tt6Isop(~uVar25,~uVar25,uVar51,(int *)&local_12f8);
              if (0x40 < (int)(uint)local_12f8) {
LAB_006e6f38:
                __assert_fail("nCubes <= 64",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                              ,0x76f,"int Abc_Tt6CnfSize(word, int)");
              }
              Vec_IntPush(&p->vCnfSizes,(uint)local_12f8);
              uVar51 = (uint)puVar64[2];
            }
            if (uVar24 < uVar51 >> 0x1b) {
              __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                            ,0x1fa,
                            "int Mf_CutComputeTruth6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                           );
            }
            if (uVar24 <= uVar51 >> 0x1b) goto LAB_006e59c9;
          }
          else {
            iVar44 = iVar65 + -6;
            uVar52 = 1 << ((byte)iVar44 & 0x1f);
            pVVar13 = p->vTtMem;
            uVar51 = (uint)local_1378[2];
            uVar40 = uVar51 >> 1 & 0x3ffffff;
            if (pVVar13->nEntries <= (int)uVar40) {
LAB_006e6da5:
              __assert_fail("i >= 0 && i < p->nEntries",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                            ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
            }
            bVar35 = (byte)pVVar13->LogPageSze;
            uVar25 = puVar45[2];
            uVar55 = (uint)uVar25 >> 1 & 0x3ffffff;
            if ((uint)pVVar13->nEntries <= uVar55) goto LAB_006e6da5;
            iVar57 = (uVar40 & pVVar13->PageMask) * pVVar13->nEntrySize;
            pwVar59 = pVVar13->ppPages[uVar40 >> (bVar35 & 0x1f)];
            iVar41 = (uVar55 & pVVar13->PageMask) * pVVar13->nEntrySize;
            pwVar15 = pVVar13->ppPages[uVar55 >> (bVar35 & 0x1f)];
            uVar32 = puVar64[2];
            if ((uVar51 & 1) == uVar39) {
              if (iVar44 != 0x1f) {
                uVar33 = 0;
                do {
                  (&local_12f8)[uVar33] = pwVar59[(long)iVar57 + uVar33];
                  uVar33 = uVar33 + 1;
                } while (uVar52 != uVar33);
              }
            }
            else if (iVar44 != 0x1f) {
              uVar33 = 0;
              do {
                (&local_12f8)[uVar33] = ~pwVar59[(long)iVar57 + uVar33];
                uVar33 = uVar33 + 1;
              } while (uVar52 != uVar33);
            }
            if (((uint)uVar25 & 1) == uVar50) {
              if (iVar44 != 0x1f) {
                uVar25 = 0;
                do {
                  local_1278[uVar25] = pwVar15[(long)iVar41 + uVar25];
                  uVar25 = uVar25 + 1;
                } while (uVar52 != uVar25);
              }
            }
            else if (iVar44 != 0x1f) {
              uVar25 = 0;
              do {
                local_1278[uVar25] = ~pwVar15[(long)iVar41 + uVar25];
                uVar25 = uVar25 + 1;
              } while (uVar52 != uVar25);
            }
            uVar40 = (uint)uVar32 >> 0x1b;
            uVar25 = (ulong)uVar40;
            uVar55 = (uVar51 >> 0x1b) - 1;
            if (0x7ffffff < uVar51 && 0x7ffffff < (uint)uVar32) {
              do {
                uVar32 = uVar25 - 1;
                iVar57 = *(int *)((long)local_1378 + (ulong)uVar55 * 4 + 0x14);
                iVar41 = *(int *)((long)puVar64 + uVar32 * 4 + 0x14);
                if (iVar41 <= iVar57) {
                  if (iVar41 != iVar57) goto LAB_006e6d86;
                  if (uVar55 < uVar32) {
                    Abc_TtSwapVars(&local_12f8,iVar65,uVar55,(int)uVar32);
                  }
                  uVar55 = uVar55 - 1;
                }
              } while ((1 < uVar25) && (uVar25 = uVar32, -1 < (int)uVar55));
            }
            if (uVar55 != 0xffffffff) {
LAB_006e6e21:
              __assert_fail("k == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                            ,0x5a3,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
            }
            uVar51 = ((uint)puVar45[2] >> 0x1b) - 1;
            if ((0x7ffffff < (uint)puVar45[2]) && (0x7ffffff < (uint)puVar64[2])) {
              uVar25 = (ulong)((uint)puVar64[2] >> 0x1b);
              do {
                uVar32 = uVar25 - 1;
                iVar57 = *(int *)((long)puVar45 + (ulong)uVar51 * 4 + 0x14);
                iVar41 = *(int *)((long)puVar64 + uVar32 * 4 + 0x14);
                if (iVar41 <= iVar57) {
                  if (iVar41 != iVar57) {
LAB_006e6d86:
                    __assert_fail("pCut[i] == pCut0[k]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                                  ,0x59e,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
                  }
                  if (uVar51 < uVar32) {
                    Abc_TtSwapVars(local_1278,iVar65,uVar51,(int)uVar32);
                  }
                  uVar51 = uVar51 - 1;
                }
              } while ((1 < uVar25) && (uVar25 = uVar32, -1 < (int)uVar51));
            }
            if (uVar51 != 0xffffffff) goto LAB_006e6e21;
            if ((bVar70 && -1 < (int)uVar38) && bVar69) {
              uVar51 = ((uint)local_1278[0] ^ (uint)local_12f8) & 1;
              if (uVar51 == 0) {
                uVar55 = 0;
                if (iVar44 != 0x1f) {
                  uVar25 = 0;
                  do {
                    (&local_1058)[uVar25] = local_1278[uVar25] ^ (&local_12f8)[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar52 != uVar25);
                }
              }
              else {
                uVar55 = 1;
                if (iVar44 != 0x1f) {
                  uVar25 = 0;
                  do {
                    (&local_1058)[uVar25] = ~((&local_12f8)[uVar25] ^ local_1278[uVar25]);
                    uVar25 = uVar25 + 1;
                    uVar55 = uVar51;
                  } while (uVar52 != uVar25);
                }
              }
            }
            else {
              uVar51 = (uint)local_1278[0] & (uint)local_12f8 & 1;
              if (uVar51 == 0) {
                uVar55 = 0;
                if (iVar44 != 0x1f) {
                  uVar25 = 0;
                  do {
                    (&local_1058)[uVar25] = local_1278[uVar25] & (&local_12f8)[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar52 != uVar25);
                }
              }
              else {
                uVar55 = 1;
                if (iVar44 != 0x1f) {
                  uVar25 = 0;
                  do {
                    (&local_1058)[uVar25] = ~(local_1278[uVar25] & (&local_12f8)[uVar25]);
                    uVar25 = uVar25 + 1;
                    uVar55 = uVar51;
                  } while (uVar52 != uVar25);
                }
              }
            }
            iVar44 = Abc_TtMinBase(&local_1058,pVars,(uint)puVar64[2] >> 0x1b,iVar65);
            *(uint *)(puVar64 + 2) = (uint)puVar64[2] & 0x7ffffff | iVar44 << 0x1b;
            if ((local_1058 & 1) != 0) {
              __assert_fail("(uTruth[0] & 1) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                            ,0x212,
                            "int Mf_CutComputeTruth(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                           );
            }
            uVar51 = Vec_MemHashInsert(p->vTtMem,&local_1058);
            if ((int)uVar51 < 0) goto LAB_006e6e40;
            uVar25 = puVar64[2];
            uVar52 = (uint)uVar25 & 0xf8000000 | uVar55 + (uVar51 & 0x3ffffff) * 2;
            *(uint *)(puVar64 + 2) = uVar52;
            if (((p->pPars->fGenCnf != 0) && (iVar65 < 9)) && (uVar51 == (p->vCnfSizes).nSize)) {
              uVar51 = (uint)uVar25 >> 0x1b;
              local_1158._0_4_ = (uint)local_1058 ^ 0xffffffff;
              local_1158._4_4_ = local_1058._4_4_ ^ 0xffffffff;
              uStack_1150 = (uint)uStack_1050 ^ 0xffffffff;
              uStack_114c = uStack_1050._4_4_ ^ 0xffffffff;
              local_1148 = local_1048 ^ 0xffffffff;
              uStack_1144 = uStack_1044 ^ 0xffffffff;
              uStack_1140 = uStack_1040 ^ 0xffffffff;
              uStack_113c = uStack_103c ^ 0xffffffff;
              iVar65 = Abc_Tt8Isop(&local_1058,&local_1058,uVar51,local_10d8);
              iVar44 = Abc_Tt8Isop(&local_1158,&local_1158,uVar51,local_10d8);
              if (0x100 < iVar44 + iVar65) {
LAB_006e6f19:
                __assert_fail("nCubes <= 256",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                              ,0x778,"int Abc_Tt8CnfSize(word *, int)");
              }
              Vec_IntPush(&p->vCnfSizes,iVar44 + iVar65);
              uVar52 = (uint)puVar64[2];
            }
            if (uVar40 < uVar52 >> 0x1b) {
              __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                            ,0x218,
                            "int Mf_CutComputeTruth(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                           );
            }
            uVar51 = (uint)puVar64[2];
            if (uVar40 <= uVar52 >> 0x1b) goto LAB_006e59c9;
          }
          if (uVar51 < 0x8000000) {
            uVar25 = 0;
          }
          else {
            uVar32 = 0;
            uVar25 = 0;
            do {
              uVar25 = uVar25 | 1L << ((ulong)*(byte *)(pVars + uVar32) & 0x3f);
              uVar32 = uVar32 + 1;
            } while (uVar51 >> 0x1b != uVar32);
          }
          *puVar64 = uVar25;
LAB_006e59c9:
          uVar52 = uVar51 >> 0x1b;
          pJVar9 = p->pPars;
          if (pJVar9->nLutSize < (int)uVar52) goto LAB_006e6de3;
          fVar2 = pMVar6->nFlowRefs;
          puVar64[1] = 0;
          if (uVar51 < 0x8000000) {
            iVar65 = 0;
            fVar72 = 0.0;
          }
          else {
            pMVar26 = p->pLfObjs;
            uVar25 = 0;
            fVar72 = 0.0;
            uVar40 = 0;
            do {
              iVar65 = *(int *)((long)puVar64 + uVar25 * 4 + 0x14);
              uVar3 = *(ushort *)&pMVar26[iVar65].field_0xc;
              uVar55 = (uint)uVar3;
              if (uVar3 < uVar40) {
                uVar55 = uVar40;
              }
              uVar40 = uVar55;
              *(uint *)(puVar64 + 1) = uVar40;
              fVar72 = fVar72 + pMVar26[iVar65].Flow;
              *(float *)((long)puVar64 + 0xc) = fVar72;
              uVar25 = uVar25 + 1;
            } while (uVar52 != uVar25);
            iVar65 = 0;
            *(uint *)(puVar64 + 1) = (uVar40 + 1) - (uint)(uVar51 < 0x10000000);
            if (0xfffffff < uVar51) {
              if (pJVar9->fGenCnf == 0) {
                if (pJVar9->fOptEdge == 0) {
                  iVar65 = 1;
                }
                else {
                  iVar65 = uVar52 + pJVar9->nAreaTuner;
                }
              }
              else {
                uVar51 = uVar51 >> 1 & 0x3ffffff;
                if ((p->vCnfSizes).nSize <= (int)uVar51) goto LAB_006e6edb;
                iVar65 = (p->vCnfSizes).pArray[uVar51];
              }
            }
          }
          *(float *)((long)puVar64 + 0xc) = ((float)iVar65 + fVar72) / fVar2;
          uVar31 = Mf_SetAddCut(&local_11f8,uVar31,nCutNum);
LAB_006e5ae2:
          puVar45 = puVar45 + 8;
          piVar63 = piVar63 + 0x10;
          if (local_c38 + (long)iVar37 * 8 <= puVar45) goto LAB_006e5af8;
          goto LAB_006e4dca;
        }
LAB_006e5af8:
        local_1378 = local_1378 + 8;
        piVar27 = piVar27 + 0x10;
      } while (local_1378 < local_838 + (long)iVar36 * 8);
    }
  }
  else {
    if ((int)uVar38 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10c,"int Abc_Lit2Var(int)");
    }
    uVar38 = uVar38 >> 1;
    iVar65 = p->pLfObjs[uVar38].iCutSet;
    if (iVar65 == 0) {
      uStack_1050 = 0;
      local_1048 = 0x8000002;
      uStack_1044 = uVar38;
      local_1058 = 1L << ((byte)uVar38 & 0x3f);
      local_1344 = 1;
    }
    else {
      uVar51 = iVar65 >> 0x10;
      if (((int)uVar51 < 0) || ((p->vPages).nSize <= (int)uVar51)) goto LAB_006e6fd3;
      pvVar29 = (p->vPages).pArray[uVar51];
      local_1344 = *(uint *)((long)pvVar29 + (ulong)(ushort)iVar65 * 4);
      if ((int)local_1344 < 1) {
        puVar45 = &local_1058;
      }
      else {
        puVar49 = (uint *)((long)pvVar29 + (ulong)(ushort)iVar65 * 4);
        puVar45 = &local_1058;
        iVar65 = 0;
        puVar1 = puVar49;
        do {
          puVar61 = puVar1 + 1;
          puVar45[1] = 0;
          uVar51 = *puVar61;
          *(uint *)(puVar45 + 2) = (uint)puVar45[2] & 0xf8000000 | uVar51 >> 5;
          *(uint *)(puVar45 + 2) = *puVar61 << 0x1b | uVar51 >> 5;
          uVar51 = *puVar61 & 0x1f;
          if (uVar51 == 0) {
            uVar25 = 0;
          }
          else {
            uVar32 = 0;
            uVar25 = 0;
            do {
              uVar25 = uVar25 | 1L << ((ulong)(byte)(puVar1 + 2)[uVar32] & 0x3f);
              uVar32 = uVar32 + 1;
            } while (uVar51 != uVar32);
          }
          *puVar45 = uVar25;
          memcpy((void *)((long)puVar45 + 0x14),puVar1 + 2,(ulong)(uVar51 << 2));
          puVar45 = puVar45 + 8;
          iVar65 = iVar65 + 1;
          puVar1 = puVar61 + (*puVar61 & 0x1f);
          local_1344 = *puVar49;
        } while (iVar65 < (int)local_1344);
      }
      if (0xfffffff < local_1048) {
        puVar45[1] = 0;
        *(undefined4 *)(puVar45 + 2) = 0x8000002;
        *(uint *)((long)puVar45 + 0x14) = uVar38;
        *puVar45 = 1L << ((byte)uVar38 & 0x3f);
        local_1344 = local_1344 + 1;
        pGVar68 = p->pGia;
      }
    }
    if (pGVar68->pMuxes == (uint *)0x0) {
      local_1334 = 0;
    }
    else {
      pGVar10 = pGVar68->pObjs;
      if ((pGVar5 < pGVar10) || (pGVar10 + pGVar68->nObjs <= pGVar5)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      local_1334 = pGVar68->pMuxes[(int)((ulong)((long)pGVar5 - (long)pGVar10) >> 2) * -0x55555555];
      if ((int)local_1334 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10d,"int Abc_LitIsCompl(int)");
      }
      local_1334 = local_1334 & 1;
    }
    p->CutCount[0] = (double)(int)(iVar37 * iVar36 * local_1344) + p->CutCount[0];
    if (0 < iVar36) {
      puVar45 = local_838;
      do {
        if (0 < iVar37) {
          local_1388 = local_c38;
          do {
            if (0 < (int)local_1344) {
              puVar64 = &local_1058;
LAB_006e5cd8:
              uVar25 = *local_1388 | *puVar45 | *puVar64;
              uVar25 = uVar25 - (uVar25 >> 1 & 0x5555555555555555);
              uVar25 = (uVar25 >> 2 & 0x3333333333333333) + (uVar25 & 0x3333333333333333);
              if ((int)(uint)(byte)(((uVar25 >> 4) + uVar25 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                   >> 0x38) <= (int)uVar48) {
                p->CutCount[1] = p->CutCount[1] + 1.0;
                puVar11 = (ulong *)local_11f0[(long)(int)uVar31 + -1];
                uVar25 = puVar45[2];
                uVar32 = local_1388[2];
                uVar33 = puVar64[2];
                piVar27 = (int *)((long)puVar11 + 0x14);
                bVar35 = 0;
                iVar65 = -0x7ffffff;
                uVar34 = 0;
                uVar42 = 0;
                uVar38 = 0;
                uVar51 = 0;
                while( true ) {
                  iVar57 = 1000000000;
                  iVar44 = 1000000000;
                  if (uVar51 != (uint)uVar25 >> 0x1b) {
                    iVar44 = *(int *)((long)puVar45 + (ulong)uVar51 * 4 + 0x14);
                  }
                  if (uVar38 != (uint)uVar32 >> 0x1b) {
                    iVar57 = *(int *)((long)local_1388 + (ulong)uVar38 * 4 + 0x14);
                  }
                  iVar41 = 1000000000;
                  if ((uint)uVar42 != (uint)uVar33 >> 0x1b) {
                    iVar41 = *(int *)((long)puVar64 + uVar42 * 4 + 0x14);
                  }
                  iVar58 = iVar57;
                  if (iVar44 < iVar57) {
                    iVar58 = iVar44;
                  }
                  iVar66 = iVar41;
                  if (iVar58 < iVar41) {
                    iVar66 = iVar58;
                  }
                  if (iVar66 == 1000000000) {
                    *(int *)(puVar11 + 2) = -iVar65;
                    uVar25 = *local_1388 | *puVar45 | *puVar64;
                    *puVar11 = uVar25;
                    if ((int)uVar31 < 1) goto LAB_006e5f14;
                    uVar38 = (uint)uVar34 & 0x1f;
                    uVar32 = 0;
                    goto LAB_006e5e7a;
                  }
                  if (uVar28 == uVar34) break;
                  *(int *)((long)puVar11 + uVar34 * 4 + 0x14) = iVar66;
                  uVar34 = uVar34 + 1;
                  uVar51 = uVar51 + (iVar44 == iVar66);
                  uVar38 = uVar38 + (iVar57 == iVar66);
                  uVar42 = (ulong)((uint)uVar42 + (uint)(iVar41 <= iVar58));
                  iVar65 = iVar65 + -0x8000000;
                  bVar35 = bVar35 + 1;
                }
              }
              goto LAB_006e6acf;
            }
LAB_006e6b27:
            local_1388 = local_1388 + 8;
          } while (local_1388 < local_c38 + (long)iVar37 * 8);
        }
        puVar45 = puVar45 + 8;
      } while (puVar45 < local_838 + (long)iVar36 * 8);
    }
  }
  pMVar6->Flow = local_11f8->Flow;
  *(short *)&pMVar6->field_0xc = (short)local_11f8->Delay;
  iVar65 = 1;
  if (0 < (int)uVar31) {
    uVar28 = 0;
    do {
      iVar65 = iVar65 + (*(uint *)(local_11f0[uVar28 - 1] + 0x10) >> 0x1b) + 1;
      uVar28 = uVar28 + 1;
    } while (uVar31 != uVar28);
  }
  uVar48 = p->iCur;
  if (0xffff < (uVar48 & 0xffff) + iVar65) {
    uVar48 = (uVar48 & 0xffff0000) + 0x10000;
    p->iCur = uVar48;
  }
  uVar50 = (p->vPages).nSize;
  uVar39 = (int)uVar48 >> 0x10;
  if (uVar50 == uVar39) {
    pvVar29 = malloc(0x40000);
    if (uVar50 == (p->vPages).nCap) {
      if ((int)uVar50 < 0x10) {
        ppvVar30 = (p->vPages).pArray;
        if (ppvVar30 == (void **)0x0) {
          ppvVar30 = (void **)malloc(0x80);
        }
        else {
          ppvVar30 = (void **)realloc(ppvVar30,0x80);
        }
        (p->vPages).pArray = ppvVar30;
        (p->vPages).nCap = 0x10;
      }
      else {
        ppvVar30 = (p->vPages).pArray;
        if (ppvVar30 == (void **)0x0) {
          ppvVar30 = (void **)malloc((ulong)uVar50 << 4);
        }
        else {
          ppvVar30 = (void **)realloc(ppvVar30,(ulong)uVar50 << 4);
        }
        (p->vPages).pArray = ppvVar30;
        (p->vPages).nCap = uVar50 * 2;
      }
    }
    else {
      ppvVar30 = (p->vPages).pArray;
    }
    iVar44 = (p->vPages).nSize;
    uVar50 = iVar44 + 1;
    (p->vPages).nSize = uVar50;
    ppvVar30[iVar44] = pvVar29;
    uVar48 = p->iCur;
    uVar39 = (int)uVar48 >> 0x10;
  }
  p->iCur = iVar65 + uVar48;
  if ((-1 < (int)uVar39) && ((int)uVar39 < (int)uVar50)) {
    pvVar29 = (p->vPages).pArray[uVar39];
    *(uint *)((long)pvVar29 + (ulong)(uVar48 & 0xffff) * 4) = uVar31;
    if ((int)uVar31 < 1) {
      pMVar6->iCutSet = uVar48;
    }
    else {
      puVar49 = (uint *)((long)pvVar29 + (ulong)(uVar48 & 0xffff) * 4);
      uVar28 = 0;
      do {
        lVar53 = local_11f0[uVar28 - 1];
        puVar49[1] = *(uint *)(lVar53 + 0x10) << 5 | *(uint *)(lVar53 + 0x10) >> 0x1b;
        memcpy(puVar49 + 2,(void *)(lVar53 + 0x14),
               (ulong)(*(uint *)(lVar53 + 0x10) >> 0x19 & 0xfffffffc));
        puVar49 = puVar49 + 1 + (*(uint *)(lVar53 + 0x10) >> 0x1b);
        uVar28 = uVar28 + 1;
      } while (uVar31 != uVar28);
      pMVar6->iCutSet = uVar48;
      if ((int)uVar31 < (int)nCutNum) {
        p->nCutCounts[*(uint *)&local_11f8->field_0x10 >> 0x1b] =
             p->nCutCounts[*(uint *)&local_11f8->field_0x10 >> 0x1b] + 1;
        p->CutCount[3] = (double)(int)uVar31 + p->CutCount[3];
        return;
      }
    }
    __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                  ,0x423,"void Mf_ObjMergeOrder(Mf_Man_t *, int)");
  }
LAB_006e6fd3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
LAB_006e5e7a:
  do {
    puVar12 = (ulong *)local_11f0[uVar32 - 1];
    uVar51 = (uint)puVar12[2] >> 0x1b;
    if ((uVar51 <= uVar38) && ((*puVar12 & ~uVar25) == 0)) {
      if (uVar38 == uVar51) {
        if (iVar65 == -0x7ffffff) goto LAB_006e6acf;
        uVar33 = 0;
        while (piVar27[uVar33] == *(int *)((long)puVar12 + uVar33 * 4 + 0x14)) {
          uVar33 = uVar33 + 1;
          if ((bVar35 & 0x1f) == uVar33) goto LAB_006e6acf;
        }
      }
      else {
        if (uVar38 <= uVar51) goto LAB_006e6dc4;
        if ((uint)puVar12[2] < 0x8000000) goto LAB_006e6acf;
        uVar33 = 0;
        uVar52 = 0;
        do {
          iVar44 = *(int *)((long)puVar12 + (long)(int)uVar52 * 4 + 0x14);
          if (iVar44 < piVar27[uVar33]) break;
          if ((piVar27[uVar33] == iVar44) && (uVar52 = uVar52 + 1, uVar52 == uVar51))
          goto LAB_006e6acf;
          uVar33 = uVar33 + 1;
        } while ((bVar35 & 0x1f) != uVar33);
      }
    }
    uVar32 = uVar32 + 1;
  } while (uVar32 != uVar31);
LAB_006e5f14:
  p->CutCount[2] = p->CutCount[2] + 1.0;
  if (p->pPars->fCutMin == 0) {
    uVar38 = (uint)puVar11[2];
  }
  else {
    iVar65 = p->pPars->nLutSize;
    if (iVar65 < 7) {
      pVVar13 = p->vTtMem;
      uVar38 = (uint)puVar45[2];
      uVar52 = uVar38 >> 1 & 0x3ffffff;
      uVar51 = pVVar13->nEntries;
      if ((int)uVar51 <= (int)uVar52) goto LAB_006e6da5;
      bVar35 = (byte)pVVar13->LogPageSze;
      uVar40 = (uint)local_1388[2];
      uVar55 = uVar40 >> 1 & 0x3ffffff;
      if (uVar51 <= uVar55) goto LAB_006e6da5;
      uVar56 = (uint)puVar64[2];
      uVar24 = uVar56 >> 1 & 0x3ffffff;
      if (uVar51 <= uVar24) goto LAB_006e6da5;
      uVar51 = (uint)puVar11[2];
      uVar60 = uVar51 >> 0x1b;
      uVar34 = (ulong)uVar60;
      ppwVar14 = pVVar13->ppPages;
      iVar65 = pVVar13->nEntrySize;
      uVar4 = pVVar13->PageMask;
      uVar25 = -(ulong)((uVar38 & 1) != uVar39) ^
               ppwVar14[uVar52 >> (bVar35 & 0x1f)][(int)((uVar52 & uVar4) * iVar65)];
      uVar32 = -(ulong)((uVar40 & 1) != uVar50) ^
               ppwVar14[uVar55 >> (bVar35 & 0x1f)][(int)((uVar55 & uVar4) * iVar65)];
      uVar33 = -(ulong)((uVar56 & 1) != local_1334) ^
               ppwVar14[uVar24 >> (bVar35 & 0x1f)][(int)((uVar24 & uVar4) * iVar65)];
      uVar52 = (uVar38 >> 0x1b) - 1;
      if (0x7ffffff < uVar38 && 0x7ffffff < uVar51) {
        lVar53 = uVar34 * 0x18 + 0x934298;
        uVar42 = uVar34;
        do {
          uVar43 = uVar42 - 1;
          uVar46 = (ulong)uVar52;
          iVar65 = *(int *)((long)puVar45 + uVar46 * 4 + 0x14);
          iVar44 = *(int *)((long)puVar11 + uVar43 * 4 + 0x14);
          if (iVar44 <= iVar65) {
            if (iVar44 != iVar65) goto LAB_006e6d67;
            if (uVar46 < uVar43) {
              bVar35 = (char)(-1 << ((byte)uVar52 & 0x1f)) + (char)(1 << ((byte)uVar43 & 0x1f));
              lVar47 = uVar46 * 0x90;
              uVar25 = (uVar25 & *(ulong *)(lVar53 + lVar47)) >> (bVar35 & 0x3f) |
                       (*(ulong *)(lVar53 + -8 + lVar47) & uVar25) << (bVar35 & 0x3f) |
                       *(ulong *)(lVar53 + -0x10 + lVar47) & uVar25;
            }
            uVar52 = uVar52 - 1;
          }
        } while ((1 < uVar42) && (lVar53 = lVar53 + -0x18, uVar42 = uVar43, -1 < (int)uVar52));
      }
      if (uVar52 != 0xffffffff) goto LAB_006e6e02;
      uVar38 = (uVar40 >> 0x1b) - 1;
      if (0x7ffffff < uVar40 && 0x7ffffff < uVar51) {
        lVar53 = uVar34 * 0x18 + 0x934298;
        uVar42 = uVar34;
        do {
          uVar43 = uVar42 - 1;
          uVar46 = (ulong)uVar38;
          iVar65 = *(int *)((long)local_1388 + uVar46 * 4 + 0x14);
          iVar44 = *(int *)((long)puVar11 + uVar43 * 4 + 0x14);
          if (iVar44 <= iVar65) {
            if (iVar44 != iVar65) goto LAB_006e6d67;
            if (uVar46 < uVar43) {
              bVar35 = (char)(-1 << ((byte)uVar38 & 0x1f)) + (char)(1 << ((byte)uVar43 & 0x1f));
              lVar47 = uVar46 * 0x90;
              uVar32 = (uVar32 & *(ulong *)(lVar53 + lVar47)) >> (bVar35 & 0x3f) |
                       (*(ulong *)(lVar53 + -8 + lVar47) & uVar32) << (bVar35 & 0x3f) |
                       *(ulong *)(lVar53 + -0x10 + lVar47) & uVar32;
            }
            uVar38 = uVar38 - 1;
          }
        } while ((1 < uVar42) && (lVar53 = lVar53 + -0x18, uVar42 = uVar43, -1 < (int)uVar38));
      }
      if (uVar38 != 0xffffffff) goto LAB_006e6e02;
      uVar38 = (uVar56 >> 0x1b) - 1;
      if (0x7ffffff < uVar56 && 0x7ffffff < uVar51) {
        lVar53 = uVar34 * 0x18 + 0x934298;
        uVar42 = uVar34;
        do {
          uVar43 = uVar42 - 1;
          uVar46 = (ulong)uVar38;
          iVar65 = *(int *)((long)puVar64 + uVar46 * 4 + 0x14);
          iVar44 = *(int *)((long)puVar11 + uVar43 * 4 + 0x14);
          if (iVar44 <= iVar65) {
            if (iVar44 != iVar65) goto LAB_006e6d67;
            if (uVar46 < uVar43) {
              bVar35 = (char)(-1 << ((byte)uVar38 & 0x1f)) + (char)(1 << ((byte)uVar43 & 0x1f));
              lVar47 = uVar46 * 0x90;
              uVar33 = (uVar33 & *(ulong *)(lVar53 + lVar47)) >> (bVar35 & 0x3f) |
                       (*(ulong *)(lVar53 + -8 + lVar47) & uVar33) << (bVar35 & 0x3f) |
                       *(ulong *)(lVar53 + -0x10 + lVar47) & uVar33;
            }
            uVar38 = uVar38 - 1;
          }
        } while ((1 < uVar42) && (lVar53 = lVar53 + -0x18, uVar42 = uVar43, -1 < (int)uVar38));
      }
      if (uVar38 != 0xffffffff) goto LAB_006e6e02;
      uVar25 = (uVar32 ^ uVar25) & uVar33 ^ uVar25;
      uVar52 = (uint)uVar25 & 1;
      local_12f8 = -(ulong)uVar52 ^ uVar25;
      uVar38 = 0;
      uVar25 = local_12f8;
      if (0x7ffffff < uVar51) {
        uVar32 = 0;
        lVar53 = 0x9342a8;
        pwVar59 = s_Truths6Neg;
        uVar38 = 0;
        do {
          bVar35 = (byte)(1 << ((byte)uVar32 & 0x1f));
          if ((*pwVar59 & (uVar25 >> (bVar35 & 0x3f) ^ uVar25)) != 0) {
            lVar47 = (long)(int)uVar38;
            if (lVar47 < (long)uVar32) {
              piVar27[lVar47] = piVar27[uVar32];
              bVar35 = (char)(-1 << ((byte)uVar38 & 0x1f)) + bVar35;
              lVar47 = lVar47 * 0x90;
              uVar25 = (uVar25 & *(ulong *)(lVar53 + 8 + lVar47)) >> (bVar35 & 0x3f) |
                       (*(ulong *)(lVar53 + lVar47) & uVar25) << (bVar35 & 0x3f) |
                       *(ulong *)(lVar53 + -8 + lVar47) & uVar25;
            }
            uVar38 = uVar38 + 1;
          }
          uVar32 = uVar32 + 1;
          pwVar59 = pwVar59 + 1;
          lVar53 = lVar53 + 0x18;
        } while (uVar34 != uVar32);
      }
      uVar32 = local_12f8;
      if ((uVar38 != uVar60) && (uVar32 = uVar25, uVar34 = local_1058, (int)uVar60 <= (int)uVar38))
      goto LAB_006e6efa;
      *(uint *)(puVar11 + 2) = (uint)puVar11[2] & 0x7ffffff | uVar38 << 0x1b;
      local_12f8 = uVar32;
      if ((uVar32 & 1) != 0) {
        __assert_fail("(int)(t & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                      ,0x22b,
                      "int Mf_CutComputeTruthMux6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                     );
      }
      uVar51 = Vec_MemHashInsert(p->vTtMem,&local_12f8);
      if ((int)uVar51 < 0) goto LAB_006e6e40;
      uVar25 = puVar11[2];
      uVar38 = (uint)uVar25 & 0xf8000000 | uVar52 + (uVar51 & 0x3ffffff) * 2;
      *(uint *)(puVar11 + 2) = uVar38;
      if ((p->pPars->fGenCnf != 0) && (uVar51 == (p->vCnfSizes).nSize)) {
        uVar38 = (uint)uVar25 >> 0x1b;
        local_1278[0]._0_4_ = 0;
        Abc_Tt6Isop(uVar32,uVar32,uVar38,(int *)local_1278);
        Abc_Tt6Isop(~uVar32,~uVar32,uVar38,(int *)local_1278);
        if (0x40 < (int)(uint)local_1278[0]) goto LAB_006e6f38;
        Vec_IntPush(&p->vCnfSizes,(uint)local_1278[0]);
        uVar38 = (uint)puVar11[2];
      }
      if (uVar60 < uVar38 >> 0x1b) {
        __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                      ,0x230,
                      "int Mf_CutComputeTruthMux6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                     );
      }
      if (uVar38 >> 0x1b < uVar60) {
LAB_006e69b9:
        if (uVar38 < 0x8000000) {
          uVar25 = 0;
        }
        else {
          uVar32 = 0;
          uVar25 = 0;
          do {
            uVar25 = uVar25 | 1L << ((ulong)*(byte *)(piVar27 + uVar32) & 0x3f);
            uVar32 = uVar32 + 1;
          } while (uVar38 >> 0x1b != uVar32);
        }
        *puVar11 = uVar25;
      }
    }
    else {
      iVar44 = iVar65 + -6;
      uVar52 = 1 << ((byte)iVar44 & 0x1f);
      pVVar13 = p->vTtMem;
      uVar38 = (uint)puVar45[2];
      uVar40 = uVar38 >> 1 & 0x3ffffff;
      uVar51 = pVVar13->nEntries;
      if ((int)uVar51 <= (int)uVar40) goto LAB_006e6da5;
      bVar35 = (byte)pVVar13->LogPageSze;
      uVar25 = local_1388[2];
      uVar55 = (uint)uVar25 >> 1 & 0x3ffffff;
      if (uVar51 <= uVar55) goto LAB_006e6da5;
      uVar32 = puVar64[2];
      uVar56 = (uint)uVar32 >> 1 & 0x3ffffff;
      if (uVar51 <= uVar56) goto LAB_006e6da5;
      ppwVar14 = pVVar13->ppPages;
      iVar57 = pVVar13->nEntrySize;
      uVar51 = pVVar13->PageMask;
      iVar41 = (uVar40 & uVar51) * iVar57;
      pwVar59 = ppwVar14[uVar40 >> (bVar35 & 0x1f)];
      iVar58 = (uVar55 & uVar51) * iVar57;
      pwVar15 = ppwVar14[uVar55 >> (bVar35 & 0x1f)];
      iVar57 = (uVar56 & uVar51) * iVar57;
      pwVar16 = ppwVar14[uVar56 >> (bVar35 & 0x1f)];
      uVar33 = puVar11[2];
      if ((uVar38 & 1) == uVar39) {
        if (iVar44 != 0x1f) {
          uVar34 = 0;
          do {
            local_1278[uVar34] = pwVar59[(long)iVar41 + uVar34];
            uVar34 = uVar34 + 1;
          } while (uVar52 != uVar34);
        }
      }
      else if (iVar44 != 0x1f) {
        uVar34 = 0;
        do {
          local_1278[uVar34] = ~pwVar59[(long)iVar41 + uVar34];
          uVar34 = uVar34 + 1;
        } while (uVar52 != uVar34);
      }
      if (((uint)uVar25 & 1) == uVar50) {
        if (iVar44 != 0x1f) {
          uVar25 = 0;
          do {
            local_10d8[uVar25] = pwVar15[(long)iVar58 + uVar25];
            uVar25 = uVar25 + 1;
          } while (uVar52 != uVar25);
        }
      }
      else if (iVar44 != 0x1f) {
        uVar25 = 0;
        do {
          local_10d8[uVar25] = ~pwVar15[(long)iVar58 + uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar52 != uVar25);
      }
      if (((uint)uVar32 & 1) == local_1334) {
        if (iVar44 != 0x1f) {
          uVar25 = 0;
          do {
            (&local_1158)[uVar25] = pwVar16[(long)iVar57 + uVar25];
            uVar25 = uVar25 + 1;
          } while (uVar52 != uVar25);
        }
      }
      else if (iVar44 != 0x1f) {
        uVar25 = 0;
        do {
          (&local_1158)[uVar25] = ~pwVar16[(long)iVar57 + uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar52 != uVar25);
      }
      uVar51 = (uint)uVar33 >> 0x1b;
      uVar25 = (ulong)uVar51;
      uVar40 = (uVar38 >> 0x1b) - 1;
      if (0x7ffffff < uVar38 && 0x7ffffff < (uint)uVar33) {
        do {
          uVar32 = uVar25 - 1;
          iVar57 = *(int *)((long)puVar45 + (ulong)uVar40 * 4 + 0x14);
          iVar41 = *(int *)((long)puVar11 + uVar32 * 4 + 0x14);
          if (iVar41 <= iVar57) {
            if (iVar41 != iVar57) goto LAB_006e6d86;
            if (uVar40 < uVar32) {
              Abc_TtSwapVars(local_1278,iVar65,uVar40,(int)uVar32);
            }
            uVar40 = uVar40 - 1;
          }
        } while ((1 < uVar25) && (uVar25 = uVar32, -1 < (int)uVar40));
      }
      if (uVar40 != 0xffffffff) goto LAB_006e6e21;
      uVar38 = ((uint)local_1388[2] >> 0x1b) - 1;
      if ((0x7ffffff < (uint)local_1388[2]) && (0x7ffffff < (uint)puVar11[2])) {
        uVar25 = (ulong)((uint)puVar11[2] >> 0x1b);
        do {
          uVar32 = uVar25 - 1;
          iVar57 = *(int *)((long)local_1388 + (ulong)uVar38 * 4 + 0x14);
          iVar41 = *(int *)((long)puVar11 + uVar32 * 4 + 0x14);
          if (iVar41 <= iVar57) {
            if (iVar41 != iVar57) goto LAB_006e6d86;
            if (uVar38 < uVar32) {
              Abc_TtSwapVars(local_10d8,iVar65,uVar38,(int)uVar32);
            }
            uVar38 = uVar38 - 1;
          }
        } while ((1 < uVar25) && (uVar25 = uVar32, -1 < (int)uVar38));
      }
      if (uVar38 != 0xffffffff) goto LAB_006e6e21;
      uVar38 = ((uint)puVar64[2] >> 0x1b) - 1;
      if ((0x7ffffff < (uint)puVar64[2]) && (0x7ffffff < (uint)puVar11[2])) {
        uVar25 = (ulong)((uint)puVar11[2] >> 0x1b);
        do {
          uVar32 = uVar25 - 1;
          iVar57 = *(int *)((long)puVar64 + (ulong)uVar38 * 4 + 0x14);
          iVar41 = *(int *)((long)puVar11 + uVar32 * 4 + 0x14);
          if (iVar41 <= iVar57) {
            if (iVar41 != iVar57) goto LAB_006e6d86;
            if (uVar38 < uVar32) {
              Abc_TtSwapVars(&local_1158,iVar65,uVar38,(int)uVar32);
            }
            uVar38 = uVar38 - 1;
          }
        } while ((1 < uVar25) && (uVar25 = uVar32, -1 < (int)uVar38));
      }
      if (uVar38 != 0xffffffff) goto LAB_006e6e21;
      iVar57 = 0;
      if (iVar44 != 0x1f) {
        uVar25 = 0;
        do {
          (&local_12f8)[uVar25] =
               (local_10d8[uVar25] ^ local_1278[uVar25]) & (&local_1158)[uVar25] ^
               local_1278[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar52 != uVar25);
        if ((local_12f8 & 1) != 0) {
          uVar25 = 0;
          do {
            (&local_12f8)[uVar25] = ~(&local_12f8)[uVar25];
            uVar25 = uVar25 + 1;
          } while (uVar52 != uVar25);
          iVar57 = 1;
        }
      }
      iVar44 = Abc_TtMinBase(&local_12f8,piVar27,(uint)puVar11[2] >> 0x1b,iVar65);
      *(uint *)(puVar11 + 2) = (uint)puVar11[2] & 0x7ffffff | iVar44 << 0x1b;
      if ((local_12f8 & 1) != 0) {
        __assert_fail("(uTruth[0] & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                      ,0x249,
                      "int Mf_CutComputeTruthMux(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                     );
      }
      uVar38 = Vec_MemHashInsert(p->vTtMem,&local_12f8);
      if ((int)uVar38 < 0) goto LAB_006e6e40;
      uVar25 = puVar11[2];
      uVar52 = (uint)uVar25 & 0xf8000000 | iVar57 + (uVar38 & 0x3ffffff) * 2;
      *(uint *)(puVar11 + 2) = uVar52;
      if (((p->pPars->fGenCnf != 0) && (iVar65 < 9)) && (uVar38 == (p->vCnfSizes).nSize)) {
        uVar38 = (uint)uVar25 >> 0x1b;
        local_1178 = (uint)local_12f8 ^ 0xffffffff;
        uStack_1174 = local_12f8._4_4_ ^ 0xffffffff;
        uStack_1170 = uStack_12f0 ^ 0xffffffff;
        uStack_116c = uStack_12ec ^ 0xffffffff;
        local_1168 = local_12e8 ^ 0xffffffff;
        uStack_1164 = uStack_12e4 ^ 0xffffffff;
        uStack_1160 = uStack_12e0 ^ 0xffffffff;
        uStack_115c = uStack_12dc ^ 0xffffffff;
        iVar65 = Abc_Tt8Isop(&local_12f8,&local_12f8,uVar38,local_c58);
        iVar44 = Abc_Tt8Isop((word *)&local_1178,(word *)&local_1178,uVar38,local_c58);
        if (0x100 < iVar44 + iVar65) goto LAB_006e6f19;
        Vec_IntPush(&p->vCnfSizes,iVar44 + iVar65);
        uVar52 = (uint)puVar11[2];
      }
      uVar52 = uVar52 >> 0x1b;
      if (uVar52 >= uVar51 && uVar52 != uVar51) {
        __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                      ,0x24e,
                      "int Mf_CutComputeTruthMux(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                     );
      }
      uVar38 = (uint)puVar11[2];
      if (uVar52 < uVar51) goto LAB_006e69b9;
    }
  }
  uVar51 = uVar38 >> 0x1b;
  pJVar9 = p->pPars;
  if (pJVar9->nLutSize < (int)uVar51) goto LAB_006e6de3;
  fVar2 = pMVar6->nFlowRefs;
  puVar11[1] = 0;
  if (uVar38 < 0x8000000) {
    fVar72 = 0.0;
  }
  else {
    pMVar26 = p->pLfObjs;
    uVar25 = 0;
    fVar72 = 0.0;
    uVar52 = 0;
    do {
      iVar65 = *(int *)((long)puVar11 + uVar25 * 4 + 0x14);
      uVar3 = *(ushort *)&pMVar26[iVar65].field_0xc;
      uVar40 = (uint)uVar3;
      if (uVar3 < uVar52) {
        uVar40 = uVar52;
      }
      uVar52 = uVar40;
      *(uint *)(puVar11 + 1) = uVar52;
      fVar72 = fVar72 + pMVar26[iVar65].Flow;
      *(float *)((long)puVar11 + 0xc) = fVar72;
      uVar25 = uVar25 + 1;
    } while (uVar51 != uVar25);
    *(uint *)(puVar11 + 1) = (uVar52 + 1) - (uint)(uVar38 < 0x10000000);
    if (0xfffffff < uVar38) {
      if (pJVar9->fGenCnf == 0) {
        if (pJVar9->fOptEdge == 0) {
          iVar65 = 1;
        }
        else {
          iVar65 = uVar51 + pJVar9->nAreaTuner;
        }
      }
      else {
        uVar38 = uVar38 >> 1 & 0x3ffffff;
        if ((p->vCnfSizes).nSize <= (int)uVar38) goto LAB_006e6edb;
        iVar65 = (p->vCnfSizes).pArray[uVar38];
      }
      goto LAB_006e6a73;
    }
  }
  iVar65 = 0;
LAB_006e6a73:
  *(float *)((long)puVar11 + 0xc) = ((float)iVar65 + fVar72) / fVar2;
  uVar31 = Mf_SetAddCut(&local_11f8,uVar31,nCutNum);
LAB_006e6acf:
  puVar64 = puVar64 + 8;
  if (&local_1058 + (long)(int)local_1344 * 8 <= puVar64) goto LAB_006e6b27;
  goto LAB_006e5cd8;
}

Assistant:

void Mf_ObjMergeOrder( Mf_Man_t * p, int iObj )
{
    Mf_Cut_t pCuts0[MF_CUT_MAX], pCuts1[MF_CUT_MAX], pCuts[MF_CUT_MAX], * pCutsR[MF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    Mf_Obj_t * pBest = Mf_ManObj(p, iObj);
    int nLutSize = p->pPars->nLutSize;
    int nCutNum  = p->pPars->nCutNum;
    int nCuts0   = Mf_ManPrepareCuts(pCuts0, p, Gia_ObjFaninId0(pObj, iObj), 1);
    int nCuts1   = Mf_ManPrepareCuts(pCuts1, p, Gia_ObjFaninId1(pObj, iObj), 1);
    int fComp0   = Gia_ObjFaninC0(pObj);
    int fComp1   = Gia_ObjFaninC1(pObj);
    int iSibl    = Gia_ObjSibl(p->pGia, iObj);
    Mf_Cut_t * pCut0, * pCut1, * pCut0Lim = pCuts0 + nCuts0, * pCut1Lim = pCuts1 + nCuts1;
    int i, nCutsR = 0;
    for ( i = 0; i < nCutNum; i++ )
        pCutsR[i] = pCuts + i;
    if ( iSibl )
    {
        Mf_Cut_t pCuts2[MF_CUT_MAX];
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCuts2 = Mf_ManPrepareCuts(pCuts2, p, iSibl, 0);
        Mf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            *pCutsR[nCutsR] = *pCut2;
            if ( pCutsR[nCutsR]->iFunc >= 0 )
                pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Mf_Cut_t pCuts2[MF_CUT_MAX];
        int nCuts2  = Mf_ManPrepareCuts(pCuts2, p, Gia_ObjFaninId2(p->pGia, iObj), 1);
        int fComp2  = Gia_ObjFaninC2(p->pGia, pObj);
        Mf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Mf_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Mf_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Mf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Mf_CutComputeTruthMux(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Mf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Mf_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Mf_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Mf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Mf_CutComputeTruth(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Mf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
//    if ( iObj % 1000 == 0 )
//    if ( iObj == 474 )
    {
        printf( "*** Obj = %d  FlowRefs = %.2f  MapRefs = %2d\n", iObj, pBest->nFlowRefs, pBest->nMapRefs );
        for ( i = 0; i < nCutsR; i++ )
            Mf_CutPrint( p, pCutsR[i] );
        printf( "\n" );
    } 
    // store the cutset
    pBest->Flow = pCutsR[0]->Flow;
    pBest->Delay = pCutsR[0]->Delay;
    pBest->iCutSet = Mf_ManSaveCuts( p, pCutsR, nCutsR );
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
//    assert( Mf_SetCheckArray(pCutsR, nCutsR) );
    p->nCutCounts[pCutsR[0]->nLeaves]++;
    p->CutCount[3] += nCutsR;
}